

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

int publickey_response_id(uchar **pdata,size_t data_len)

{
  uint32_t uVar1;
  int iVar2;
  char *__s1;
  ulong __n;
  char **ppcVar3;
  uchar *puVar4;
  
  if (3 < data_len) {
    puVar4 = *pdata;
    uVar1 = _libssh2_ntohu32(puVar4);
    __n = (ulong)uVar1;
    if (__n <= data_len - 4) {
      puVar4 = puVar4 + 4;
      __s1 = "status";
      ppcVar3 = &publickey_response_codes[1].name;
      do {
        if (((long)(int)ppcVar3[-2] == __n) &&
           (iVar2 = strncmp(__s1,(char *)puVar4,__n), iVar2 == 0)) {
          *pdata = puVar4 + __n;
          return (int)ppcVar3[-4];
        }
        __s1 = *ppcVar3;
        ppcVar3 = ppcVar3 + 3;
      } while (__s1 != (char *)0x0);
    }
  }
  return -1;
}

Assistant:

static int
publickey_response_id(unsigned char **pdata, size_t data_len)
{
    size_t response_len;
    unsigned char *data = *pdata;
    const LIBSSH2_PUBLICKEY_CODE_LIST *codes = publickey_response_codes;

    if(data_len < 4) {
        /* Malformed response */
        return -1;
    }
    response_len = _libssh2_ntohu32(data);
    data += 4;
    data_len -= 4;
    if(data_len < response_len) {
        /* Malformed response */
        return -1;
    }

    while(codes->name) {
        if((unsigned long)codes->name_len == response_len &&
            strncmp(codes->name, (char *) data, response_len) == 0) {
            *pdata = data + response_len;
            return codes->code;
        }
        codes++;
    }

    return -1;
}